

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::ClearDependencyInformation(cmTarget *this,cmMakefile *mf)

{
  string *psVar1;
  undefined1 local_38 [8];
  string depname;
  cmMakefile *mf_local;
  cmTarget *this_local;
  
  depname.field_2._8_8_ = mf;
  psVar1 = GetName_abi_cxx11_(this);
  std::__cxx11::string::string((string *)local_38,(string *)psVar1);
  std::__cxx11::string::operator+=((string *)local_38,"_LIB_DEPENDS");
  cmMakefile::RemoveCacheDefinition((cmMakefile *)depname.field_2._8_8_,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmTarget::ClearDependencyInformation(cmMakefile& mf)
{
  std::string depname = this->GetName();
  depname += "_LIB_DEPENDS";
  mf.RemoveCacheDefinition(depname);
}